

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_cts.c
# Opt level: O0

size_t cts128_cs3_encrypt(PROV_CIPHER_CTX *ctx,uchar *in,uchar *out,size_t len)

{
  int iVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t residue;
  aligned_16bytes tmp_in;
  size_t local_48;
  size_t local_40;
  undefined1 local_38 [16];
  size_t local_28;
  void *local_20;
  void *local_18;
  long local_10;
  size_t local_8;
  
  if (in_RCX < 0x10) {
    local_8 = 0;
  }
  else if (in_RCX == 0x10) {
    local_28 = in_RCX;
    iVar1 = (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,in_RDX,in_RSI,0x10);
    if (iVar1 == 0) {
      local_48 = 0;
    }
    else {
      local_48 = local_28;
    }
    local_8 = local_48;
  }
  else {
    local_40 = in_RCX & 0xf;
    if (local_40 == 0) {
      local_40 = 0x10;
    }
    local_28 = in_RCX - local_40;
    local_20 = (void *)in_RDX;
    local_18 = (void *)in_RSI;
    local_10 = in_RDI;
    iVar1 = (**(code **)(*(long *)(in_RDI + 0xa8) + 8))(in_RDI,in_RDX,in_RSI,local_28);
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else {
      local_18 = (void *)(local_28 + (long)local_18);
      local_20 = (void *)(local_28 + (long)local_20);
      memset(local_38,0,0x10);
      memcpy(local_38,local_18,local_40);
      memcpy(local_20,(void *)((long)local_20 + -0x10),local_40);
      iVar1 = (**(code **)(*(long *)(local_10 + 0xa8) + 8))
                        (local_10,(long)local_20 + -0x10,local_38,0x10);
      if (iVar1 == 0) {
        local_8 = 0;
      }
      else {
        local_8 = local_28 + local_40;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t cts128_cs3_encrypt(PROV_CIPHER_CTX *ctx, const unsigned char *in,
                                 unsigned char *out, size_t len)
{
    aligned_16bytes tmp_in;
    size_t residue;

    if (len < CTS_BLOCK_SIZE)  /* CS3 requires at least one block */
        return 0;

    /* If we only have one block then just process the aligned block */
    if (len == CTS_BLOCK_SIZE)
        return ctx->hw->cipher(ctx, out, in, len) ? len : 0;

    residue = len % CTS_BLOCK_SIZE;
    if (residue == 0)
        residue = CTS_BLOCK_SIZE;
    len -= residue;

    if (!ctx->hw->cipher(ctx, out, in, len))
        return 0;

    in += len;
    out += len;

    memset(tmp_in.c, 0, sizeof(tmp_in));
    memcpy(tmp_in.c, in, residue);
    memcpy(out, out - CTS_BLOCK_SIZE, residue);
    if (!ctx->hw->cipher(ctx, out - CTS_BLOCK_SIZE, tmp_in.c, CTS_BLOCK_SIZE))
        return 0;
    return len + residue;
}